

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::AddFirst
          (DecodeDataBuilder *this,char desired,char input)

{
  char cVar1;
  char input_local;
  char desired_local;
  DecodeDataBuilder *this_local;
  
  if (desired == input) {
    this->op_ = '\0';
  }
  else {
    cVar1 = ascii_toupper(input);
    if (desired == cVar1) {
      this->op_ = '@';
    }
    else {
      cVar1 = ascii_tolower(input);
      if (desired != cVar1) {
        return false;
      }
      this->op_ = ' ';
    }
  }
  AddChar(this,desired);
  return true;
}

Assistant:

bool AddFirst(const char desired, const char input) {
    if (desired == input) {
      op_ = kOpAsIs;
    } else if (desired == ascii_toupper(input)) {
      op_ = kOpFirstUpper;
    } else if (desired == ascii_tolower(input)) {
      op_ = kOpFirstLower;
    } else {
      // Can't be transformed to match.
      return false;
    }
    AddChar(desired);
    return true;
  }